

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O3

void ppMulEq(word *c,word *a,word *b,size_t n,void *stack)

{
  word *pwVar1;
  word *pwVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  word *t;
  word *c_00;
  ulong uVar7;
  long lVar8;
  
  if (9 < n) {
    if ((n & 1) == 0) {
      uVar5 = n >> 1;
      ppMulEq(c,a,b,uVar5,stack);
      pwVar1 = (word *)((long)b + n * 4);
      pwVar2 = (word *)((long)a + n * 4);
      ppMulEq(c + n,pwVar2,pwVar1,uVar5,stack);
      uVar7 = 0;
      do {
        *(word *)((long)stack + uVar7 * 8) = pwVar2[uVar7] ^ a[uVar7];
        *(word *)((long)stack + uVar7 * 8 + n * 4) = pwVar1[uVar7] ^ b[uVar7];
        *(word *)((long)stack + uVar7 * 8 + n * 8) =
             (c + n)[uVar7] ^ *(ulong *)((long)c + uVar7 * 8 + n * 4);
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      ppMulEq(c + uVar5,(word *)stack,(word *)((long)stack + uVar5 * 8),uVar5,
              (void *)((long)stack + uVar5 * 0x18));
      uVar7 = uVar5;
      do {
        c[uVar5] = c[uVar5] ^ *(ulong *)((long)stack + n * 8) ^ *c;
        c[n] = c[n] ^ *(ulong *)((long)stack + n * 8) ^ c[uVar5 * 3];
        c = c + 1;
        stack = (void *)((long)stack + 8);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    else {
      uVar5 = n + 1;
      uVar7 = uVar5 >> 1;
      ppMulEq(c,a,b,uVar7,stack);
      c_00 = c + n + 1;
      ppMulEq(c_00,(word *)((long)a + n * 4 + 4),(word *)((long)b + n * 4 + 4),n - uVar7,stack);
      pwVar1 = c + uVar7;
      pwVar2 = (word *)((long)stack + uVar7 * 8);
      if (uVar5 < 3) {
        lVar3 = 0;
      }
      else {
        lVar3 = 0;
        do {
          *(word *)((long)stack + lVar3 * 8) = a[uVar7 + lVar3] ^ a[lVar3];
          pwVar2[lVar3] = b[uVar7 + lVar3] ^ b[lVar3];
          *(word *)((long)stack + lVar3 * 8 + n * 8 + 8) = c_00[lVar3] ^ pwVar1[lVar3];
          lVar3 = lVar3 + 1;
        } while (uVar7 - 1 != lVar3);
      }
      *(word *)((long)stack + lVar3 * 8) = a[lVar3];
      *(word *)((long)stack + (lVar3 + uVar7) * 8) = b[lVar3];
      *(word *)((long)stack + (lVar3 + uVar5) * 8) = c[lVar3 + uVar5] ^ c[lVar3 + uVar7];
      ppMulEq(pwVar1,(word *)stack,pwVar2,uVar7,(void *)((long)stack + uVar7 * 0x18));
      if (uVar5 < 5) {
        lVar3 = 0;
      }
      else {
        uVar4 = 3;
        if (3 < uVar7) {
          uVar4 = uVar7;
        }
        lVar3 = uVar4 - 2;
        lVar6 = n * 8 + 8;
        lVar8 = 0;
        do {
          pwVar1[lVar8] = pwVar1[lVar8] ^ *(ulong *)((long)stack + lVar8 * 8 + lVar6) ^ c[lVar8];
          c_00[lVar8] = c_00[lVar8] ^
                        *(ulong *)((long)stack + lVar8 * 8 + lVar6) ^ c[uVar7 * 3 + lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar3 != lVar8);
      }
      lVar6 = lVar3 + uVar5;
      pwVar1[lVar3] = pwVar1[lVar3] ^ *(ulong *)((long)stack + lVar6 * 8) ^ c[lVar3];
      c[lVar6] = c[lVar6] ^ *(ulong *)((long)stack + lVar6 * 8);
      lVar6 = lVar3 + uVar5 + 1;
      pwVar1[lVar3 + 1] = pwVar1[lVar3 + 1] ^ *(ulong *)((long)stack + lVar6 * 8) ^ c[lVar3 + 1];
      c[lVar6] = c[lVar6] ^ *(ulong *)((long)stack + lVar6 * 8);
    }
    return;
  }
  (*_mul_procs[n])(c,a,b,stack);
  return;
}

Assistant:

static void ppMulEq(word c[], const word a[], const word b[], size_t n,
	void* stack)
{
	ASSERT(wwIsDisjoint2(a, n, c, 2 * n));
	ASSERT(wwIsDisjoint2(b, n, c, 2 * n));
	// умножение многочленов малой длины
	if (n < COUNT_OF(_mul_procs))
		_mul_procs[n](c, a, b, stack);
	// усеченный алгоритм Карацубы, n --- четное
	else if ((n & 1) == 0)
	{
		word* t = (word*)stack;
		size_t m = n / 2, i;
		// c1 || c0 <- a0 b0
		ppMulEq(c, a, b, m, t);
		// c3 || c2 <- a1 b1
		ppMulEq(c + 2 * m, a + m, b + m, m, t);
		// t0 <- a0 + a1, t1 <- b0 + b1, t2 <- c1 + c2
		for (i = 0; i < m; ++i)
			t[i] = a[i] ^ a[m + i],
			t[m + i] = b[i] ^ b[m + i],
			t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		// c2 || c1 <- t0 t1
		ppMulEq(c + m, t, t + m, m, t + 3 * m);
		// c1 <- c1 + c0 + t2, c2 <- c2 + c3 + t2
		for (i = 0; i < m; ++i)
			c[m + i] ^= c[i] ^ t[2 * m + i],
			c[2 * m + i] ^= c[3 * m + i] ^ t[2 * m + i];
	}
	// усеченный алгоритм Карацубы, n --- нечетное
	else
	{
		word* t = (word*)stack;
		size_t m = (n + 1) / 2, i;
		// c1 || c0 <- a0 b0
		ppMulEq(c, a, b, m, t);
		// c3 || c2 <- a1 b1
		ppMulEq(c + 2 * m, a + m, b + m, n - m, t);
		// t0 <- a0 + a1, t1 <- b0 + b1, t2 <- c1 + c2
		for (i = 0; i + 1 < m; ++i)
			t[i] = a[i] ^ a[m + i],
			t[m + i] = b[i] ^ b[m + i],
			t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		t[i] = a[i];
		t[m + i] = b[i];
		t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		// c2 || c1 <- t0 t1
		ppMulEq(c + m, t, t + m, m, t + 3 * m);
		// c1 <- c1 + c0 + t2, c2 <- c2 + c3 + t2
		for (i = 0; i + 2 < m; ++i)
			c[m + i] ^= c[i] ^ t[2 * m + i],
			c[2 * m + i] ^= c[3 * m + i] ^ t[2 * m + i];
		c[m + i] ^= c[i] ^ t[2 * m + i];
		c[2 * m + i] ^= t[2 * m + i];
		++i;
		c[m + i] ^= c[i] ^ t[2 * m + i];
		c[2 * m + i] ^= t[2 * m + i];
	}
}